

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QSize __thiscall QMdi::ControlLabel::sizeHint(ControlLabel *this)

{
  QSize QVar1;
  long in_FS_OFFSET;
  QSizeF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.wd = (qreal)QPixmap::deviceIndependentSize();
  QVar1 = QSizeF::toSize(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

QSize ControlLabel::sizeHint() const
{
    return label.deviceIndependentSize().toSize();
}